

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O2

BOOL FILEInitStdHandles(void)

{
  HANDLE hObject;
  HANDLE pVVar1;
  HANDLE pVVar2;
  
  if (PAL_InitializeChakraCoreCalled) {
    hObject = init_std_handle(&pStdIn,_stdin);
    if (hObject == (HANDLE)0xffffffffffffffff) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_00322c2b;
    }
    else {
      pVVar1 = init_std_handle(&pStdOut,_stdout);
      if (pVVar1 == (HANDLE)0xffffffffffffffff) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_00322c2b;
      }
      else {
        pVVar2 = init_std_handle(&pStdErr,_stderr);
        if (pVVar2 != (HANDLE)0xffffffffffffffff) {
          return 1;
        }
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_00322c2b;
        CloseHandle(hObject);
        hObject = pVVar1;
      }
      CloseHandle(hObject);
    }
    pStdErr = (HANDLE)0xffffffffffffffff;
    pStdOut = (HANDLE)0xffffffffffffffff;
    pStdIn = (HANDLE)0xffffffffffffffff;
    return 0;
  }
LAB_00322c2b:
  abort();
}

Assistant:

BOOL FILEInitStdHandles(void)
{
    HANDLE stdin_handle;
    HANDLE stdout_handle;
    HANDLE stderr_handle;

    TRACE("creating handle objects for stdin, stdout, stderr\n");

    stdin_handle = init_std_handle(&pStdIn, stdin);
    if(INVALID_HANDLE_VALUE == stdin_handle)
    {
        ERROR("failed to create stdin handle\n");
        goto fail;
    }

    stdout_handle = init_std_handle(&pStdOut, stdout);
    if(INVALID_HANDLE_VALUE == stdout_handle)
    {
        ERROR("failed to create stdout handle\n");
        CloseHandle(stdin_handle);
        goto fail;
    }

    stderr_handle = init_std_handle(&pStdErr, stderr);
    if(INVALID_HANDLE_VALUE == stderr_handle)
    {
        ERROR("failed to create stderr handle\n");
        CloseHandle(stdin_handle);
        CloseHandle(stdout_handle);
        goto fail;
    }
    return TRUE;

fail:
    pStdIn = INVALID_HANDLE_VALUE;
    pStdOut = INVALID_HANDLE_VALUE;
    pStdErr = INVALID_HANDLE_VALUE;
    return FALSE;
}